

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int ARKodeSetJacTimesRhsFn(void *arkode_mem,ARKRhsFn jtimesRhsFn)

{
  long lVar1;
  long lVar2;
  int line;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar3 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x3c9;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar3 = -0x30;
    error_code = -0x30;
    line = 0x3d2;
  }
  else {
    lVar1 = (**(code **)((long)arkode_mem + 0x140))(arkode_mem);
    if (lVar1 == 0) {
      msgfmt = "Linear solver memory is NULL.";
      iVar3 = -2;
      error_code = -2;
      line = 0xff8;
    }
    else if (*(int *)(lVar1 + 0xf0) == 0) {
      msgfmt = "Internal finite-difference Jacobian-vector product is disabled.";
      iVar3 = -3;
      error_code = -3;
      line = 0x3de;
    }
    else {
      if (jtimesRhsFn != (ARKRhsFn)0x0) {
        *(ARKRhsFn *)(lVar1 + 0x108) = jtimesRhsFn;
        return 0;
      }
      lVar2 = (**(code **)((long)arkode_mem + 0x148))(arkode_mem);
      *(long *)(lVar1 + 0x108) = lVar2;
      if (lVar2 != 0) {
        return 0;
      }
      msgfmt = "Time step module is missing implicit RHS fcn";
      iVar3 = -3;
      error_code = -3;
      line = 0x3eb;
    }
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeSetJacTimesRhsFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int ARKodeSetJacTimesRhsFn(void* arkode_mem, ARKRhsFn jtimesRhsFn)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(arkls_mem->jtimesDQ))
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) { arkls_mem->Jt_f = jtimesRhsFn; }
  else
  {
    arkls_mem->Jt_f = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}